

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void * generate_func_and_redirect_to_bb_gen(MIR_context_t ctx,MIR_item_t func_item)

{
  undefined8 *puVar1;
  void *pvVar2;
  gen_ctx_t gen_ctx;
  MIR_insn_t pMVar3;
  MIR_context_t ctx_00;
  MIR_item_t pMVar4;
  MIR_insn_t_conflict pMVar5;
  long lVar6;
  MIR_insn_t *ppMVar7;
  void *pvVar8;
  MIR_insn_t_conflict pMVar9;
  MIR_func_t pMVar10;
  MIR_lref_data *pMVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  size_t size;
  void *addr;
  void *local_60;
  MIR_context_t local_58;
  MIR_item_t local_50;
  long local_48;
  void *local_40;
  void *local_38;
  
  size = 0;
  local_50 = func_item;
  generate_func_code(ctx,func_item,0);
  gen_ctx = ctx->gen_ctx;
  pMVar9 = (((gen_ctx->curr_func_item->u).func)->insns).head;
  if (pMVar9 != (MIR_insn_t_conflict)0x0) {
    uVar13 = 1;
    lVar6 = 0;
    do {
      iVar12 = (int)*(undefined8 *)&pMVar9->field_0x18;
      if (((uVar13 & 1) != 0) || (iVar12 == 0xb4)) {
        pMVar3 = pMVar9;
        if (iVar12 == 0xb4) {
          do {
            pMVar9 = pMVar3;
            pMVar3 = (pMVar9->insn_link).next;
            if (pMVar3 == (MIR_insn_t)0x0) break;
          } while (*(int *)&pMVar3->field_0x18 == 0xb4);
          iVar12 = (int)*(undefined8 *)&pMVar9->field_0x18;
        }
        lVar6 = lVar6 + 1;
      }
      uVar13 = 1;
      if (iVar12 - 0xa5U < 0xffffffd1) {
        if (iVar12 - 0xa6U < 0x13) {
          uVar13 = 0x60071 >> (iVar12 - 0xa6U & 0x1f);
        }
        else {
          uVar13 = 0;
        }
      }
      pMVar9 = (pMVar9->insn_link).next;
    } while (pMVar9 != (MIR_insn_t)0x0);
    size = lVar6 * 0x28;
  }
  ctx_00 = gen_ctx->ctx;
  local_58 = ctx;
  local_40 = gen_malloc(gen_ctx,size);
  pMVar4 = gen_ctx->curr_func_item;
  pMVar4->data = local_40;
  pMVar10 = (pMVar4->u).func;
  pMVar9 = (pMVar10->insns).head;
  if (pMVar9 == (MIR_insn_t_conflict)0x0) {
    lVar6 = 0;
  }
  else {
    uVar13 = 1;
    lVar6 = 0;
    do {
      if (((uVar13 & 1) != 0) || (iVar12 = (int)*(undefined8 *)&pMVar9->field_0x18, iVar12 == 0xb4))
      {
        if (lVar6 != 0) {
          *(MIR_insn_t *)((long)local_40 + lVar6 * 0x28 + -8) = (pMVar9->insn_link).prev;
        }
        *(MIR_item_t *)((long)local_40 + lVar6 * 0x28 + 0x10) = pMVar4;
        *(MIR_insn_t_conflict *)((long)local_40 + lVar6 * 0x28 + 0x18) = pMVar9;
        puVar1 = (undefined8 *)((long)local_40 + lVar6 * 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        iVar12 = (int)*(undefined8 *)&pMVar9->field_0x18;
        if (iVar12 == 0xb4) {
          pvVar8 = (void *)((long)local_40 + lVar6 * 0x28);
          pMVar9->data = pvVar8;
          pMVar5 = (pMVar9->insn_link).next;
          if ((pMVar5 != (MIR_insn_t_conflict)0x0) && (*(int *)&pMVar5->field_0x18 == 0xb4)) {
            do {
              pMVar9 = pMVar5;
              pMVar9->data = pvVar8;
              pMVar5 = (pMVar9->insn_link).next;
              if (pMVar5 == (MIR_insn_t)0x0) break;
            } while (*(int *)&pMVar5->field_0x18 == 0xb4);
            iVar12 = (int)*(undefined8 *)&pMVar9->field_0x18;
          }
        }
        lVar6 = lVar6 + 1;
      }
      uVar13 = 1;
      if (iVar12 - 0xa5U < 0xffffffd1) {
        if (iVar12 - 0xa6U < 0x13) {
          uVar13 = 0x60071 >> (iVar12 - 0xa6U & 0x1f);
        }
        else {
          uVar13 = 0;
        }
      }
      pMVar9 = (pMVar9->insn_link).next;
    } while (pMVar9 != (MIR_insn_t)0x0);
    pMVar10 = (pMVar4->u).func;
  }
  *(MIR_insn_t_conflict *)((long)local_40 + lVar6 * 0x28 + -8) = (pMVar10->insns).tail;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
     (fwrite("BBs for lazy code generation:\n",0x1e,1,(FILE *)gen_ctx->debug_file),
     pvVar8 = local_40, lVar6 != 0)) {
    lVar14 = 0;
    local_48 = lVar6;
    do {
      pvVar2 = (void *)((long)pvVar8 + lVar14 * 0x28);
      fprintf((FILE *)gen_ctx->debug_file,"  BBStub%llx:\n",pvVar2);
      ppMVar7 = (MIR_insn_t *)((long)pvVar8 + lVar14 * 0x28 + 0x18);
      do {
        pMVar9 = *ppMVar7;
        MIR_output_insn(ctx_00,gen_ctx->debug_file,pMVar9,(gen_ctx->curr_func_item->u).func,1);
        ppMVar7 = &(pMVar9->insn_link).next;
      } while (pMVar9 != *(MIR_insn_t_conflict *)((long)pvVar2 + 0x20));
      lVar14 = lVar14 + 1;
    } while (lVar14 != local_48);
  }
  pMVar11 = ((gen_ctx->curr_func_item->u).func)->first_lref;
  if (pMVar11 != (MIR_lref_data *)0x0) {
    do {
      get_bb_version(gen_ctx,(bb_stub_t)pMVar11->label->data,0,(spot_attr_t *)0x0,0,&local_60);
      pvVar8 = local_60;
      if (pMVar11->label2 != (MIR_label_t)0x0) {
        get_bb_version(gen_ctx,(bb_stub_t)pMVar11->label2->data,0,(spot_attr_t *)0x0,0,&local_38);
        pvVar8 = (void *)((long)local_60 - (long)local_38);
      }
      *(long *)pMVar11->load_addr = (long)pvVar8 + pMVar11->disp;
      pMVar11 = pMVar11->next;
    } while (pMVar11 != (MIR_lref_data *)0x0);
  }
  pMVar4 = local_50;
  get_bb_version(gen_ctx,(bb_stub_t)local_50->data,0,(spot_attr_t *)0x0,1,&local_60);
  _MIR_redirect_thunk(local_58,pMVar4->addr,local_60);
  return pMVar4->addr;
}

Assistant:

static void *generate_func_and_redirect_to_bb_gen (MIR_context_t ctx, MIR_item_t func_item) {
  generate_func_and_redirect (ctx, func_item, FALSE);
  return func_item->addr;
}